

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.c
# Opt level: O0

exr_result_t
exr_uncompress_buffer
          (exr_const_context_t ctxt,void *in,size_t in_bytes,void *out,size_t out_bytes_avail,
          size_t *actual_out)

{
  undefined8 in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t actual_in_bytes;
  libdeflate_result res;
  libdeflate_decompressor *decomp;
  _func_void_void_ptr *local_68;
  code *local_58;
  long local_50;
  int local_44;
  libdeflate_decompressor *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  
  if (in_RDI == 0) {
    local_58 = internal_exr_alloc;
    local_68 = internal_exr_free;
  }
  else {
    local_58 = *(code **)(in_RDI + 0x58);
    local_68 = *(_func_void_void_ptr **)(in_RDI + 0x60);
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  libdeflate_set_memory_allocator(local_58,local_68);
  local_40 = libdeflate_alloc_decompressor();
  if (local_40 == (libdeflate_decompressor *)0x0) {
    return 1;
  }
  local_44 = libdeflate_zlib_decompress_ex
                       (local_40,local_18,local_20,local_28,local_30,&local_50,local_38);
  libdeflate_free_decompressor((libdeflate_decompressor *)0xa33767);
  if (local_44 == 0) {
    if (local_20 == local_50) {
      return 0;
    }
  }
  else {
    if (local_44 == 3) {
      return 1;
    }
    if (local_44 == 2) {
      return 0;
    }
  }
  return 0x17;
}

Assistant:

exr_result_t
exr_uncompress_buffer (
    exr_const_context_t ctxt,
    const void*         in,
    size_t              in_bytes,
    void*               out,
    size_t              out_bytes_avail,
    size_t*             actual_out)
{
    struct libdeflate_decompressor* decomp;
    enum libdeflate_result          res;
    size_t                          actual_in_bytes;
#ifdef EXR_USE_CONFIG_DEFLATE_STRUCT
    struct libdeflate_options opt = {
        .sizeof_options = sizeof (struct libdeflate_options),
        .malloc_func    = ctxt ? ctxt->alloc_fn : internal_exr_alloc,
        .free_func      = ctxt ? ctxt->free_fn : internal_exr_free};
#endif

//    if (in_bytes == out_bytes_avail)
//    {
//        if (actual_out) *actual_out = in_bytes;
//        if (in != out)
//            memcpy(out, in, in_bytes);
//
//        return EXR_ERR_SUCCESS;
//    }

#ifdef EXR_USE_CONFIG_DEFLATE_STRUCT
    decomp = libdeflate_alloc_decompressor_ex (&opt);
#else
    libdeflate_set_memory_allocator (
        ctxt ? ctxt->alloc_fn : internal_exr_alloc,
        ctxt ? ctxt->free_fn : internal_exr_free);
    decomp = libdeflate_alloc_decompressor ();
#endif
    if (decomp)
    {
        res = libdeflate_zlib_decompress_ex (
            decomp,
            in,
            in_bytes,
            out,
            out_bytes_avail,
            &actual_in_bytes,
            actual_out);

        libdeflate_free_decompressor (decomp);

        if (res == LIBDEFLATE_SUCCESS)
        {
            if (in_bytes == actual_in_bytes) return EXR_ERR_SUCCESS;
            /* it's an error to not consume the full buffer, right? */
        }
        else if (res == LIBDEFLATE_INSUFFICIENT_SPACE)
        {
            return EXR_ERR_OUT_OF_MEMORY;
        }
        else if (res == LIBDEFLATE_SHORT_OUTPUT)
        {
            /* TODO: is this an error? */
            return EXR_ERR_SUCCESS;
        }
        return EXR_ERR_CORRUPT_CHUNK;
    }
    return EXR_ERR_OUT_OF_MEMORY;
}